

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FileWatcherGeneric.cpp
# Opt level: O0

void __thiscall efsw::FileWatcherGeneric::removeWatch(FileWatcherGeneric *this,WatchID watchid)

{
  bool bVar1;
  reference ppWVar2;
  const_iterator local_40;
  Lock local_38;
  Lock lock;
  WatcherGeneric *watch;
  __normal_iterator<efsw::WatcherGeneric_**,_std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>_>
  local_20;
  iterator it;
  WatchID watchid_local;
  FileWatcherGeneric *this_local;
  
  it._M_current = (WatcherGeneric **)watchid;
  local_20._M_current =
       (WatcherGeneric **)
       std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>::begin
                 (&this->mWatches);
  while( true ) {
    watch = (WatcherGeneric *)
            std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>::end
                      (&this->mWatches);
    bVar1 = __gnu_cxx::operator!=
                      (&local_20,
                       (__normal_iterator<efsw::WatcherGeneric_**,_std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>_>
                        *)&watch);
    if (!bVar1) {
      return;
    }
    ppWVar2 = __gnu_cxx::
              __normal_iterator<efsw::WatcherGeneric_**,_std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>_>
              ::operator*(&local_20);
    if ((WatcherGeneric **)((*ppWVar2)->super_Watcher).ID == it._M_current) break;
    __gnu_cxx::
    __normal_iterator<efsw::WatcherGeneric_**,_std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>_>
    ::operator++(&local_20);
  }
  ppWVar2 = __gnu_cxx::
            __normal_iterator<efsw::WatcherGeneric_**,_std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>_>
            ::operator*(&local_20);
  lock.mMutex = (Mutex *)*ppWVar2;
  Lock::Lock(&local_38,&this->mWatchesLock);
  __gnu_cxx::
  __normal_iterator<efsw::WatcherGeneric*const*,std::vector<efsw::WatcherGeneric*,std::allocator<efsw::WatcherGeneric*>>>
  ::__normal_iterator<efsw::WatcherGeneric**>
            ((__normal_iterator<efsw::WatcherGeneric*const*,std::vector<efsw::WatcherGeneric*,std::allocator<efsw::WatcherGeneric*>>>
              *)&local_40,&local_20);
  std::vector<efsw::WatcherGeneric_*,_std::allocator<efsw::WatcherGeneric_*>_>::erase
            (&this->mWatches,local_40);
  if (lock.mMutex != (Mutex *)0x0) {
    if (lock.mMutex != (Mutex *)0x0) {
      (**(code **)((long)&(lock.mMutex)->mMutexImpl->mMutex + 8))();
    }
    lock.mMutex = (Mutex *)0x0;
  }
  Lock::~Lock(&local_38);
  return;
}

Assistant:

void FileWatcherGeneric::removeWatch( WatchID watchid ) {
	WatchList::iterator it = mWatches.begin();

	for ( ; it != mWatches.end(); ++it ) {
		if ( ( *it )->ID == watchid ) {
			WatcherGeneric* watch = ( *it );

			Lock lock( mWatchesLock );

			mWatches.erase( it );

			efSAFE_DELETE( watch );

			return;
		}
	}
}